

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_plm::llm_build_plm
          (llm_build_plm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  llama_hparams *plVar5;
  ggml_context *pgVar6;
  int64_t iVar7;
  size_t sVar8;
  pointer plVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ggml_tensor *pgVar16;
  undefined8 uVar17;
  ggml_tensor *pgVar18;
  ggml_tensor *cur;
  ggml_tensor *pgVar19;
  long lVar20;
  int il;
  long lVar21;
  int iVar22;
  long lVar23;
  float fVar24;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  fVar24 = (float)((this->super_llm_graph_context).hparams)->n_embd_head_k;
  if (fVar24 < 0.0) {
    fVar24 = sqrtf(fVar24);
  }
  else {
    fVar24 = SQRT(fVar24);
  }
  plVar5 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar5->n_rot;
  uVar2 = plVar5->n_embd_head_k;
  uVar3 = plVar5->n_lora_kv;
  pgVar10 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar11 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    iVar22 = uVar2 - uVar1;
    lVar20 = 0;
    lVar21 = 0;
    do {
      il = (int)lVar21;
      pgVar12 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar10,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar20),
                           (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"attn_norm",il);
      pgVar13 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wq + lVar20),
                             pgVar12);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      iVar7 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar13->type,((this->super_llm_graph_context).hparams)->n_embd_head_k)
      ;
      uVar15 = ggml_row_size(pgVar13->type,
                             (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_k *
                             (this->super_llm_graph_context).n_head);
      pgVar16 = (ggml_tensor *)ggml_view_3d(pgVar6,pgVar13,iVar22,iVar7,(long)iVar4,uVar14,uVar15,0)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_nope",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      iVar7 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar13->type,((this->super_llm_graph_context).hparams)->n_embd_head_k)
      ;
      uVar15 = ggml_row_size(pgVar13->type,
                             (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_k *
                             (this->super_llm_graph_context).n_head);
      uVar17 = ggml_row_size(pgVar13->type,iVar22);
      pgVar13 = (ggml_tensor *)
                ggml_view_3d(pgVar6,pgVar13,uVar1,iVar7,(long)iVar4,uVar14,uVar15,uVar17);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q_pe",il);
      pgVar12 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wkv_a_mqa +
                              lVar20),pgVar12);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"kv_pe_compresseed",il);
      pgVar18 = (ggml_tensor *)
                ggml_view_2d((this->super_llm_graph_context).ctx0,pgVar12,uVar3,
                             (long)(this->super_llm_graph_context).n_tokens,pgVar12->nb[1],0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar18,"kv_compressed",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      sVar8 = pgVar12->nb[1];
      uVar14 = ggml_row_size(pgVar12->type,uVar3);
      pgVar12 = (ggml_tensor *)ggml_view_3d(pgVar6,pgVar12,uVar1,1,(long)iVar4,sVar8,sVar8,uVar14);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"k_pe",il);
      pgVar18 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar18,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->attn_kv_a_norm +
                            lVar20),(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar18,"kv_compressed",il);
      pgVar18 = (ggml_tensor *)
                ggml_mul_mat((this->super_llm_graph_context).ctx0,
                             *(undefined8 *)
                              ((long)&((model->layers).
                                       super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->wkv_b + lVar20),
                             pgVar18);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar18,"kv",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      iVar7 = (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar18->type,
                             ((this->super_llm_graph_context).hparams)->n_embd_head_v + iVar22);
      uVar15 = ggml_row_size(pgVar18->type,
                             (ulong)(((this->super_llm_graph_context).hparams)->n_embd_head_v +
                                    iVar22) * (this->super_llm_graph_context).n_head);
      cur = (ggml_tensor *)ggml_view_3d(pgVar6,pgVar18,iVar22,iVar7,(long)iVar4,uVar14,uVar15,0);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"k_nope",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      iVar7 = (this->super_llm_graph_context).n_head;
      uVar2 = ((this->super_llm_graph_context).hparams)->n_embd_head_v;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar18->type,iVar22 + uVar2);
      uVar15 = ggml_row_size(pgVar18->type,
                             (ulong)(((this->super_llm_graph_context).hparams)->n_embd_head_v +
                                    iVar22) * (this->super_llm_graph_context).n_head);
      uVar17 = ggml_row_size(pgVar18->type,iVar22);
      pgVar19 = (ggml_tensor *)
                ggml_view_3d(pgVar6,pgVar18,uVar2,iVar7,(long)iVar4,uVar14,uVar15,uVar17);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"v_states",il);
      pgVar19 = (ggml_tensor *)ggml_cont((this->super_llm_graph_context).ctx0,pgVar19);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar19,"v_states",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      lVar23 = (ulong)((this->super_llm_graph_context).hparams)->n_embd_head_v *
               (this->super_llm_graph_context).n_head;
      iVar4 = (this->super_llm_graph_context).n_tokens;
      uVar14 = ggml_row_size(pgVar18->type,lVar23);
      pgVar18 = (ggml_tensor *)ggml_view_2d(pgVar6,pgVar19,lVar23,(long)iVar4,uVar14,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar18,"v_states",il);
      pgVar13 = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,pgVar13,pgVar11,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar13,"q_pe",il);
      pgVar12 = (ggml_tensor *)
                ggml_rope_ext((this->super_llm_graph_context).freq_base,
                              (this->super_llm_graph_context).freq_scale,
                              (this->super_llm_graph_context).ext_factor,
                              (this->super_llm_graph_context).attn_factor,
                              (this->super_llm_graph_context).beta_fast,
                              (this->super_llm_graph_context).beta_slow,
                              (this->super_llm_graph_context).ctx0,pgVar12,pgVar11,0,
                              (int)(this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).rope_type,
                              (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"k_pe",il);
      pgVar16 = (ggml_tensor *)ggml_concat((this->super_llm_graph_context).ctx0,pgVar16,pgVar13,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar16,"q_states",il);
      pgVar6 = (this->super_llm_graph_context).ctx0;
      uVar14 = ggml_repeat(pgVar6,pgVar12,pgVar13);
      pgVar12 = (ggml_tensor *)ggml_concat(pgVar6,cur,uVar14,0);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"k_states",il);
      pgVar12 = llm_graph_context::build_attn
                          (&this->super_llm_graph_context,inp,gf,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->wo + lVar20),
                           (ggml_tensor *)0x0,pgVar16,pgVar12,pgVar18,(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,1.0 / fVar24,il);
      if (lVar21 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar13 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar12 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar12,pgVar13)
        ;
        pgVar10 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar10,pgVar13)
        ;
      }
      pgVar10 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar12,pgVar10);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"ffn_inp",il);
      pgVar12 = llm_graph_context::build_norm
                          (&this->super_llm_graph_context,pgVar10,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar20),
                           (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_norm",il);
      plVar9 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar12 = llm_graph_context::build_ffn
                          (&this->super_llm_graph_context,pgVar12,
                           *(ggml_tensor **)((long)&plVar9->ffn_up + lVar20),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar9->ffn_down + lVar20),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_RELU_SQR
                           ,LLM_FFN_SEQ,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_out",il);
      pgVar10 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar12,pgVar10);
      pgVar10 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar10,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"l_out",il);
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0x4f0;
    } while (lVar21 < (this->super_llm_graph_context).n_layer);
  }
  pgVar11 = llm_graph_context::build_norm
                      (&this->super_llm_graph_context,pgVar10,model->output_norm,(ggml_tensor *)0x0,
                       LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar11;
  pgVar11 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar11);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar11;
  ggml_build_forward_expand(gf,pgVar11);
  return;
}

Assistant:

llm_build_plm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const float kq_scale = 1.0f/sqrtf(float(hparams.n_embd_head_k));

        const uint32_t n_embd_head_qk_rope = hparams.n_rot;
        const uint32_t n_embd_head_qk_nope = hparams.n_embd_head_k - hparams.n_rot;
        const uint32_t kv_lora_rank = hparams.n_lora_kv;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                ggml_tensor * q = NULL;
                q = ggml_mul_mat(ctx0, model.layers[il].wq, cur);
                cb(q, "q", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * q_nope = ggml_view_3d(ctx0, q, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        0);
                cb(q_nope, "q_nope", il);

                // and {n_head * n_embd_head_qk_rope, n_tokens}
                ggml_tensor * q_pe = ggml_view_3d(ctx0, q, n_embd_head_qk_rope, n_head, n_tokens,
                        ggml_row_size(q->type, hparams.n_embd_head_k),
                        ggml_row_size(q->type, hparams.n_embd_head_k * n_head),
                        ggml_row_size(q->type, n_embd_head_qk_nope));
                cb(q_pe, "q_pe", il);

                // {n_embd, kv_lora_rank + n_embd_head_qk_rope} * {n_embd, n_tokens} -> {kv_lora_rank + n_embd_head_qk_rope, n_tokens}
                ggml_tensor * kv_pe_compresseed = ggml_mul_mat(ctx0, model.layers[il].wkv_a_mqa, cur);
                cb(kv_pe_compresseed, "kv_pe_compresseed", il);

                // split into {kv_lora_rank, n_tokens}
                ggml_tensor * kv_compressed = ggml_view_2d(ctx0, kv_pe_compresseed, kv_lora_rank, n_tokens,
                        kv_pe_compresseed->nb[1],
                        0);
                cb(kv_compressed, "kv_compressed", il);

                // and {n_embd_head_qk_rope, n_tokens}
                ggml_tensor * k_pe = ggml_view_3d(ctx0, kv_pe_compresseed, n_embd_head_qk_rope, 1, n_tokens,
                        kv_pe_compresseed->nb[1],
                        kv_pe_compresseed->nb[1],
                        ggml_row_size(kv_pe_compresseed->type, kv_lora_rank));
                cb(k_pe, "k_pe", il);

                kv_compressed = build_norm(kv_compressed,
                        model.layers[il].attn_kv_a_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(kv_compressed, "kv_compressed", il);

                // {kv_lora_rank, n_head * (n_embd_head_qk_nope + n_embd_head_v)} * {kv_lora_rank, n_tokens} -> {n_head * (n_embd_head_qk_nope + n_embd_head_v), n_tokens}
                ggml_tensor * kv = ggml_mul_mat(ctx0, model.layers[il].wkv_b, kv_compressed);
                cb(kv, "kv", il);

                // split into {n_head * n_embd_head_qk_nope, n_tokens}
                ggml_tensor * k_nope = ggml_view_3d(ctx0, kv, n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(kv->type, n_embd_head_qk_nope + hparams.n_embd_head_v),
                        ggml_row_size(kv->type, n_head * (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        0);
                cb(k_nope, "k_nope", il);

                // and {n_head * n_embd_head_v, n_tokens}
                ggml_tensor * v_states = ggml_view_3d(ctx0, kv, hparams.n_embd_head_v, n_head, n_tokens,
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope + hparams.n_embd_head_v)*n_head),
                        ggml_row_size(kv->type, (n_embd_head_qk_nope)));
                cb(v_states, "v_states", il);

                v_states = ggml_cont(ctx0, v_states);
                cb(v_states, "v_states", il);

                v_states = ggml_view_2d(ctx0, v_states, hparams.n_embd_head_v * n_head, n_tokens,
                        ggml_row_size(kv->type, hparams.n_embd_head_v * n_head),
                        0);
                cb(v_states, "v_states", il);

                q_pe = ggml_rope_ext(
                        ctx0, q_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(q_pe, "q_pe", il);

                // shared RoPE key
                k_pe = ggml_rope_ext(
                        ctx0, k_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );
                cb(k_pe, "k_pe", il);

                ggml_tensor * q_states = ggml_concat(ctx0, q_nope, q_pe, 0);
                cb(q_states, "q_states", il);

                ggml_tensor * k_states = ggml_concat(ctx0, k_nope, ggml_repeat(ctx0, k_pe, q_pe), 0);
                cb(k_states, "k_states", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        q_states, k_states, v_states, nullptr, nullptr, kq_scale, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    NULL, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_RELU_SQR, LLM_FFN_SEQ, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }